

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ac39fa::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  string sStack_48;
  
  this->count = -1;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[14]>
            (&sStack_48,(char (*) [27])"_CMAKE_SYSTEM_PREFIX_PATH_",name,(char (*) [14])0x6ae88b);
  cVar1 = cmMakefile::GetDefinition(makefile,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (cVar1.Value != (string *)0x0) {
    cmStrToLong(cVar1.Value,&this->count);
  }
  cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[14]>
            (&sStack_48,(char (*) [27])"_CMAKE_SYSTEM_PREFIX_PATH_",name,(char (*) [14])0x6ae8ba);
  cVar1 = cmMakefile::GetDefinition(makefile,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->value);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(*to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }